

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::printApertures(Station *this)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RDI;
  int i;
  int a;
  int local_10;
  int local_c;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Angle ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 8));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x40); local_c = local_c + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"aperture ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_c);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_10 = 0;
    while( true ) {
      iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0));
      if (iVar1 <= local_10) break;
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RDI + 0x58),(long)local_c);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar4,(long)local_10);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,pvVar5->first);
      poVar2 = std::operator<<(poVar2,"-");
      pvVar4 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RDI + 0x58),(long)local_c);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar4,(long)local_10);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,pvVar5->second);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void Station::printApertures() {
    cout << "Angle "<< angle << endl;
    for (int a=0; a<max_apertures;a++) {
      cout << "aperture " << a << endl;
      for (int i=0; i<collimator.getXdim(); i++) {
        cout << A[a][i].first << "-" << A[a][i].second << endl;
      }
    }
  }